

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::EnhancedLayouts::XFBCaptureInactiveOutputVariableTest::verifyBuffers
          (XFBCaptureInactiveOutputVariableTest *this,bufferCollection *buffers)

{
  ostringstream *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer ppVar4;
  Buffer *this_01;
  bufferDescriptor *pbVar5;
  undefined8 *puVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined8 *puVar8;
  GLchar *__s;
  size_t sVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  ppVar4 = (buffers->m_vector).
           super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_01 = ppVar4[1].m_buffer;
  pbVar5 = ppVar4[1].m_descriptor;
  Utils::Buffer::Bind(this_01);
  iVar7 = (*this_01->m_context->m_renderCtx->_vptr_RenderContext[3])();
  puVar8 = (undefined8 *)
           Utils::Buffer::Map((Functions *)CONCAT44(extraout_var,iVar7),this_01->m_buffer,ReadOnly);
  puVar6 = *(undefined8 **)
            &(pbVar5->m_expected_data).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  auVar11[0] = -(*(char *)(puVar6 + 4) == *(char *)(puVar8 + 4));
  auVar11[1] = -(*(char *)((long)puVar6 + 0x21) == *(char *)((long)puVar8 + 0x21));
  auVar11[2] = -(*(char *)((long)puVar6 + 0x22) == *(char *)((long)puVar8 + 0x22));
  auVar11[3] = -(*(char *)((long)puVar6 + 0x23) == *(char *)((long)puVar8 + 0x23));
  auVar11[4] = -(*(char *)((long)puVar6 + 0x24) == *(char *)((long)puVar8 + 0x24));
  auVar11[5] = -(*(char *)((long)puVar6 + 0x25) == *(char *)((long)puVar8 + 0x25));
  auVar11[6] = -(*(char *)((long)puVar6 + 0x26) == *(char *)((long)puVar8 + 0x26));
  auVar11[7] = -(*(char *)((long)puVar6 + 0x27) == *(char *)((long)puVar8 + 0x27));
  auVar11[8] = -(*(char *)(puVar6 + 5) == *(char *)(puVar8 + 5));
  auVar11[9] = -(*(char *)((long)puVar6 + 0x29) == *(char *)((long)puVar8 + 0x29));
  auVar11[10] = -(*(char *)((long)puVar6 + 0x2a) == *(char *)((long)puVar8 + 0x2a));
  auVar11[0xb] = -(*(char *)((long)puVar6 + 0x2b) == *(char *)((long)puVar8 + 0x2b));
  auVar11[0xc] = -(*(char *)((long)puVar6 + 0x2c) == *(char *)((long)puVar8 + 0x2c));
  auVar11[0xd] = -(*(char *)((long)puVar6 + 0x2d) == *(char *)((long)puVar8 + 0x2d));
  auVar11[0xe] = -(*(char *)((long)puVar6 + 0x2e) == *(char *)((long)puVar8 + 0x2e));
  auVar11[0xf] = -(*(char *)((long)puVar6 + 0x2f) == *(char *)((long)puVar8 + 0x2f));
  uVar1 = puVar8[1];
  uVar2 = *puVar8;
  uVar3 = puVar6[1];
  auVar12[0] = -((char)*puVar6 == (char)uVar2);
  auVar12[1] = -((char)((ulong)*puVar6 >> 8) == (char)((ulong)uVar2 >> 8));
  auVar12[2] = -(*(char *)((long)puVar6 + 2) == (char)((ulong)uVar2 >> 0x10));
  auVar12[3] = -(*(char *)((long)puVar6 + 3) == (char)((ulong)uVar2 >> 0x18));
  auVar12[4] = -(*(char *)((long)puVar6 + 4) == (char)((ulong)uVar2 >> 0x20));
  auVar12[5] = -(*(char *)((long)puVar6 + 5) == (char)((ulong)uVar2 >> 0x28));
  auVar12[6] = -(*(char *)((long)puVar6 + 6) == (char)((ulong)uVar2 >> 0x30));
  auVar12[7] = -(*(char *)((long)puVar6 + 7) == (char)((ulong)uVar2 >> 0x38));
  auVar12[8] = -(*(char *)(puVar6 + 1) == (char)uVar1);
  auVar12[9] = -((char)((ulong)uVar3 >> 8) == (char)((ulong)uVar1 >> 8));
  auVar12[10] = -((char)((ulong)uVar3 >> 0x10) == (char)((ulong)uVar1 >> 0x10));
  auVar12[0xb] = -((char)((ulong)uVar3 >> 0x18) == (char)((ulong)uVar1 >> 0x18));
  auVar12[0xc] = -((char)((ulong)uVar3 >> 0x20) == (char)((ulong)uVar1 >> 0x20));
  auVar12[0xd] = -((char)((ulong)uVar3 >> 0x28) == (char)((ulong)uVar1 >> 0x28));
  auVar12[0xe] = -((char)((ulong)uVar3 >> 0x30) == (char)((ulong)uVar1 >> 0x30));
  auVar12[0xf] = -((char)((ulong)uVar3 >> 0x38) == (char)((ulong)uVar1 >> 0x38));
  auVar12 = auVar12 & auVar11;
  bVar10 = (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff;
  if (!bVar10) {
    local_1a8._0_8_ =
         ((this->super_BufferTestBase).super_TestBase.super_TestCase.m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Invalid result. Buffer: ",0x18);
    __s = Utils::Buffer::GetBufferName(pbVar5->m_target);
    sVar9 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Index: ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
  }
  Utils::Buffer::UnMap(this_01);
  return bVar10;
}

Assistant:

bool XFBCaptureInactiveOutputVariableTest::verifyBuffers(bufferCollection& buffers)
{
	bool result = true;

	bufferCollection::pair& pair	   = buffers.m_vector[1] /* xfb */;
	Utils::Buffer*			buffer	 = pair.m_buffer;
	bufferDescriptor*		descriptor = pair.m_descriptor;

	/* Get pointer to contents of buffer */
	buffer->Bind();
	GLubyte* buffer_data = (GLubyte*)buffer->Map(Utils::Buffer::ReadOnly);

	/* Get pointer to expected data */
	GLubyte* expected_data = (GLubyte*)&descriptor->m_expected_data[0];

	/* Compare */
	static const GLuint vec4_size = 16;

	int res_gohan = memcmp(buffer_data + 2 * vec4_size, expected_data + 2 * vec4_size, vec4_size);
	int res_goten = memcmp(buffer_data + 0 * vec4_size, expected_data + 0 * vec4_size, vec4_size);

	if ((0 != res_gohan) || (0 != res_goten))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Invalid result. Buffer: " << Utils::Buffer::GetBufferName(descriptor->m_target)
			<< ". Index: " << descriptor->m_index << tcu::TestLog::EndMessage;

		result = false;
	}

	/* Release buffer mapping */
	buffer->UnMap();

	return result;
}